

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.cpp
# Opt level: O1

bool __thiscall HPack::Decoder::decodeIndexedField(Decoder *this,BitIStream *inputStream)

{
  bool bVar1;
  bool bVar2;
  ssize_t sVar3;
  size_t in_RCX;
  void *in_RDX;
  byte bVar4;
  long in_FS_OFFSET;
  quint32 index;
  QByteArray local_68;
  QByteArray local_48;
  quint32 local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = 0;
  sVar3 = BitIStream::read(inputStream,(int)&local_24,in_RDX,in_RCX);
  if ((char)sVar3 == '\0') {
    BitIStream::error(inputStream);
  }
  else if (local_24 != 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = (char *)0x0;
    local_48.d.size = 0;
    local_68.d.d = (Data *)0x0;
    local_68.d.ptr = (char *)0x0;
    local_68.d.size = 0;
    bVar1 = FieldLookupTable::field(&this->lookupTable,local_24,&local_48,&local_68);
    if (bVar1) {
      bVar2 = processDecodedField(this,(BitPattern)0x101,&local_48,&local_68);
      inputStream = (BitIStream *)(ulong)bVar2;
    }
    bVar4 = (byte)inputStream;
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (bVar1) goto LAB_001dcd39;
  }
  bVar4 = 0;
LAB_001dcd39:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool Decoder::decodeIndexedField(BitIStream &inputStream)
{
    quint32 index = 0;
    if (inputStream.read(&index)) {
        if (!index) {
            // "The index value of 0 is not used.
            //  It MUST be treated as a decoding
            //  error if found in an indexed header
            //  field representation."
            return false;
        }

        QByteArray name, value;
        if (lookupTable.field(index, &name, &value))
            return processDecodedField(Indexed, name, value);
    } else {
        handleStreamError(inputStream);
    }

    return false;
}